

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_rb_commit_write(ma_rb *pRB,size_t sizeInBytes,void *pBufferOut)

{
  uint local_74;
  uint local_70;
  ma_uint32 newWriteOffsetLoopFlag;
  ma_uint32 newWriteOffsetInBytes;
  ma_uint32 writeOffsetLoopFlag;
  ma_uint32 writeOffsetInBytes;
  ma_uint32 writeOffset;
  void *pBufferOut_local;
  size_t sizeInBytes_local;
  ma_rb *pRB_local;
  ma_uint32 *local_40;
  ma_uint32 *local_38;
  uint local_30;
  uint local_24;
  ma_rb *local_20;
  uint local_14;
  
  if (pRB == (ma_rb *)0x0) {
    pRB_local._4_4_ = -2;
  }
  else {
    _writeOffsetInBytes = pBufferOut;
    pBufferOut_local = (void *)sizeInBytes;
    sizeInBytes_local = (size_t)pRB;
    local_20 = pRB;
    if (pRB == (ma_rb *)0x0) {
      __assert_fail("pRB != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa510,"void *ma_rb__get_write_ptr(ma_rb *)");
    }
    local_24 = pRB->encodedWriteOffset;
    if (pBufferOut == (void *)((long)pRB->pBuffer + (ulong)(local_24 & 0x7fffffff))) {
      writeOffsetLoopFlag = pRB->encodedWriteOffset;
      local_38 = &newWriteOffsetInBytes;
      local_40 = &newWriteOffsetLoopFlag;
      local_30 = writeOffsetLoopFlag;
      local_14 = local_24;
      if (local_38 == (ma_uint32 *)0x0) {
        __assert_fail("pOffsetInBytes != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                      ,0xa51b,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)")
        ;
      }
      if (local_40 == (ma_uint32 *)0x0) {
        __assert_fail("pOffsetLoopFlag != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                      ,0xa51c,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)")
        ;
      }
      pBufferOut_local._0_4_ = (int)sizeInBytes;
      local_74 = writeOffsetLoopFlag & 0x80000000;
      local_70 = (writeOffsetLoopFlag & 0x7fffffff) + (int)pBufferOut_local;
      if (pRB->subbufferSizeInBytes < local_70) {
        pRB_local._4_4_ = -2;
      }
      else {
        if (local_70 == pRB->subbufferSizeInBytes) {
          local_70 = 0;
          local_74 = local_74 ^ 0x80000000;
        }
        LOCK();
        pRB->encodedWriteOffset = local_70 | local_74;
        UNLOCK();
        pRB_local._4_4_ = 0;
      }
    }
    else {
      pRB_local._4_4_ = -2;
    }
  }
  return pRB_local._4_4_;
}

Assistant:

MA_API ma_result ma_rb_commit_write(ma_rb* pRB, size_t sizeInBytes, void* pBufferOut)
{
    ma_uint32 writeOffset;
    ma_uint32 writeOffsetInBytes;
    ma_uint32 writeOffsetLoopFlag;
    ma_uint32 newWriteOffsetInBytes;
    ma_uint32 newWriteOffsetLoopFlag;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Validate the buffer. */
    if (pBufferOut != ma_rb__get_write_ptr(pRB)) {
        return MA_INVALID_ARGS;
    }

    writeOffset = c89atomic_load_32(&pRB->encodedWriteOffset);
    ma_rb__deconstruct_offset(writeOffset, &writeOffsetInBytes, &writeOffsetLoopFlag);

    /* Check that sizeInBytes is correct. It should never go beyond the end of the buffer. */
    newWriteOffsetInBytes = (ma_uint32)(writeOffsetInBytes + sizeInBytes);
    if (newWriteOffsetInBytes > pRB->subbufferSizeInBytes) {
        return MA_INVALID_ARGS;    /* <-- sizeInBytes will cause the read offset to overflow. */
    }

    /* Move the read pointer back to the start if necessary. */
    newWriteOffsetLoopFlag = writeOffsetLoopFlag;
    if (newWriteOffsetInBytes == pRB->subbufferSizeInBytes) {
        newWriteOffsetInBytes = 0;
        newWriteOffsetLoopFlag ^= 0x80000000;
    }

    c89atomic_exchange_32(&pRB->encodedWriteOffset, ma_rb__construct_offset(newWriteOffsetLoopFlag, newWriteOffsetInBytes));
    return MA_SUCCESS;
}